

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucheventhandle.cpp
# Opt level: O2

bool __thiscall TouchEventHandle::onHandleEvent(TouchEventHandle *this,Event *e)

{
  Handle *pHVar1;
  int iVar2;
  ostream *poVar3;
  
  if (e == (Event *)0x0) {
    return false;
  }
  if (e->_type == TYPE_TOUCH) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[TOUCH] handling touch event");
    std::endl<char,std::char_traits<char>>(poVar3);
    return true;
  }
  pHVar1 = (this->super_EventHandle).super_Handle._successor;
  if (pHVar1 != (Handle *)0x0) {
    iVar2 = (*pHVar1->_vptr_Handle[2])();
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool TouchEventHandle::onHandleEvent(Event* e)
{
	if (!e)
		return false;

	switch (e->getType()) {
	case Event::TYPE_TOUCH:
		cout<<"[TOUCH] handling touch event"<<endl;
		return true;
	default:
		break;
	}

	return EventHandle::onHandleEvent(e);
}